

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall pbrt::ThreadPool::RemoveFromJobList(ThreadPool *this,ParallelJob *job)

{
  ParallelJob *pPVar1;
  ParallelJob *pPVar2;
  ThreadPool *pTVar3;
  
  pPVar1 = job->prev;
  pPVar2 = job->next;
  pTVar3 = (ThreadPool *)&pPVar1->next;
  if (pPVar1 == (ParallelJob *)0x0) {
    pTVar3 = this;
  }
  pTVar3->jobList = pPVar2;
  if (pPVar2 != (ParallelJob *)0x0) {
    pPVar2->prev = pPVar1;
  }
  job->removed = true;
  return;
}

Assistant:

void ThreadPool::RemoveFromJobList(ParallelJob *job) {
    DCHECK(!job->removed);

    if (job->prev != nullptr) {
        job->prev->next = job->next;
    } else {
        DCHECK(jobList == job);
        jobList = job->next;
    }
    if (job->next != nullptr)
        job->next->prev = job->prev;

    job->removed = true;
}